

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

stbtt__buf stbtt__cff_index_get(stbtt__buf b,int i)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  uchar *puVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  stbtt__buf sVar14;
  
  puVar6 = b.data;
  if (b._8_8_ < 0) {
LAB_00114ca4:
    __assert_fail("!(o > b->size || o < 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/danpla[P]dpfontbaker/src/external/stb_truetype.h"
                  ,0x478,"void stbtt__buf_seek(stbtt__buf *, int)");
  }
  iVar2 = 0;
  iVar8 = 2;
  uVar1 = 0;
  do {
    uVar5 = b.size;
    if (iVar2 < (int)uVar5) {
      lVar10 = (long)iVar2;
      iVar2 = iVar2 + 1;
      uVar4 = (uint)puVar6[lVar10];
    }
    else {
      uVar4 = 0;
    }
    uVar1 = uVar1 << 8 | uVar4;
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  if (iVar2 < (int)uVar5) {
    lVar10 = (long)iVar2;
    iVar2 = iVar2 + 1;
    bVar11 = puVar6[lVar10];
  }
  else {
    bVar11 = 0;
  }
  if ((i < 0) || ((int)uVar1 <= i)) {
    __assert_fail("i >= 0 && i < count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/danpla[P]dpfontbaker/src/external/stb_truetype.h"
                  ,0x4ed,"stbtt__buf stbtt__cff_index_get(stbtt__buf, int)");
  }
  if (3 < (byte)(bVar11 - 1)) {
    __assert_fail("offsize >= 1 && offsize <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/danpla[P]dpfontbaker/src/external/stb_truetype.h"
                  ,0x4ee,"stbtt__buf stbtt__cff_index_get(stbtt__buf, int)");
  }
  uVar12 = (uint)bVar11;
  uVar4 = i * uVar12 + iVar2;
  if (uVar5 < uVar4) goto LAB_00114ca4;
  uVar3 = 0;
  uVar9 = 0;
  if (bVar11 != 0) {
    do {
      if ((int)uVar4 < (int)uVar5) {
        lVar10 = (long)(int)uVar4;
        uVar4 = uVar4 + 1;
        uVar13 = (uint)puVar6[lVar10];
      }
      else {
        uVar13 = 0;
      }
      uVar9 = uVar9 << 8 | uVar13;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  if (bVar11 != 0) {
    uVar3 = 0;
    uVar12 = (uint)bVar11;
    do {
      if ((int)uVar4 < (int)uVar5) {
        lVar10 = (long)(int)uVar4;
        uVar4 = uVar4 + 1;
        uVar13 = (uint)puVar6[lVar10];
      }
      else {
        uVar13 = 0;
      }
      uVar3 = uVar3 << 8 | uVar13;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  uVar1 = (uVar1 + 1) * (uint)bVar11 + uVar9 + 2;
  uVar3 = uVar3 - uVar9;
  if (-1 < (int)(uVar3 | uVar1)) {
    puVar7 = (uchar *)0x0;
    if ((int)uVar1 <= (int)uVar5) {
      lVar10 = 0;
      if ((int)uVar3 <= (int)(uVar5 - uVar1)) {
        puVar7 = puVar6 + uVar1;
        lVar10 = (ulong)uVar3 << 0x20;
      }
      goto LAB_00114ca2;
    }
  }
  puVar7 = (uchar *)0x0;
  lVar10 = 0;
LAB_00114ca2:
  sVar14.cursor = (int)lVar10;
  sVar14.size = (int)((ulong)lVar10 >> 0x20);
  sVar14.data = puVar7;
  return sVar14;
}

Assistant:

static void stbtt__buf_seek(stbtt__buf *b, int o)
{
   STBTT_assert(!(o > b->size || o < 0));
   b->cursor = (o > b->size || o < 0) ? b->size : o;
}